

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O2

bool __thiscall ON_AngleValue::Read(ON_AngleValue *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  AngleUnitSystem AVar2;
  LengthUnitSystem LVar3;
  StringFormat SVar4;
  byte bVar5;
  uint u;
  uint context_length_unit_system_as_unsigned;
  uint angle_unit_system_as_unsigned;
  int content_version;
  uint local_28;
  uint local_24;
  uint local_20;
  int local_1c;
  
  operator=(this,&Unset);
  local_1c = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmAnonymousChunk(archive,&local_1c);
  if (!bVar1) {
    return false;
  }
  bVar1 = ON_BinaryArchive::ReadDouble(archive,&this->m_angle);
  if (bVar1) {
    local_20 = (uint)this->m_angle_unit_system;
    bVar1 = ON_BinaryArchive::ReadInt(archive,&local_20);
    if (bVar1) {
      AVar2 = ON::AngleUnitSystemFromUnsigned(local_20);
      this->m_angle_unit_system = AVar2;
      local_24 = (uint)this->m_context_length_unit_system;
      bVar1 = ON_BinaryArchive::ReadInt(archive,&local_24);
      bVar5 = 0;
      if (!bVar1) goto LAB_005ca221;
      LVar3 = ON::LengthUnitSystemFromUnsigned(local_24);
      if (LVar3 == Unset) {
        LVar3 = None;
      }
      this->m_context_length_unit_system = LVar3;
      bVar1 = ON_BinaryArchive::ReadInt(archive,&this->m_context_locale_id);
      bVar5 = 0;
      if (!bVar1) goto LAB_005ca221;
      bVar1 = ON_BinaryArchive::ReadString(archive,&this->m_angle_as_string);
      if (bVar1) {
        bVar5 = 1;
        if (local_1c < 1) goto LAB_005ca221;
        local_28 = (uint)this->m_string_format;
        bVar1 = ON_BinaryArchive::ReadInt(archive,&local_28);
        if (bVar1) {
          SVar4 = AngleStringFormatFromUnsigned(local_28);
          this->m_string_format = SVar4;
          goto LAB_005ca221;
        }
      }
    }
  }
  bVar5 = 0;
LAB_005ca221:
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(archive);
  return (bool)(bVar1 & bVar5);
}

Assistant:

bool ON_AngleValue::Read(
  class ON_BinaryArchive& archive
)
{
  *this = ON_AngleValue::Unset;
  int content_version = 0;
  if (!archive.BeginRead3dmAnonymousChunk(&content_version))
    return false;

  bool rc = false;
  for (;;)
  {
    if (!archive.ReadDouble(&m_angle))
      break;
    unsigned int angle_unit_system_as_unsigned = static_cast<unsigned int>(m_angle_unit_system);
    if (!archive.ReadInt(&angle_unit_system_as_unsigned))
      break;
    m_angle_unit_system = ON::AngleUnitSystemFromUnsigned(angle_unit_system_as_unsigned);

    unsigned int context_length_unit_system_as_unsigned = static_cast<unsigned int>(m_context_length_unit_system);
    if (!archive.ReadInt(&context_length_unit_system_as_unsigned))
      break;
    m_context_length_unit_system = ON::LengthUnitSystemFromUnsigned(context_length_unit_system_as_unsigned);
    if (ON::LengthUnitSystem::Unset == m_context_length_unit_system)
      m_context_length_unit_system = ON::LengthUnitSystem::None;
    if (!archive.ReadInt(&m_context_locale_id))
      break;

    if (!archive.ReadString(m_angle_as_string))
      break;

    if (content_version >= 1)
    {
      // content version 1 added m_string_format
      unsigned int u = static_cast<unsigned char>(m_string_format);
      if (!archive.ReadInt(&u))
        break;
      m_string_format = ON_AngleValue::AngleStringFormatFromUnsigned(u);
    }


    rc = true;
    break;
  }
  if (!archive.EndRead3dmChunk())
    rc = false;
  return rc;
}